

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

back_insert_iterator<std::vector<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>,_std::allocator<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>_>_>_>
 __thiscall
testing::internal::
TransformTupleValuesHelper<std::tuple<pstore::command_line::opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_*>,_testing::internal::CastAndAppendTransform<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>,_std::back_insert_iterator<std::vector<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>,_std::allocator<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>_>_>_>_>
::
IterateOverTuple<std::tuple<pstore::command_line::opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_*>,_1UL>
::operator()(undefined8 param_1,undefined8 param_2,
            vector<testing::Matcher<pstore::gsl::not_null<pstore::command_line::option_const*>const&>,std::allocator<testing::Matcher<pstore::gsl::not_null<pstore::command_line::option_const*>const&>>>
            *param_3)

{
  MatcherBase<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&> MStack_28;
  
  MatcherCastImpl<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&,_pstore::command_line::opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_*>
  ::CastImpl(&MStack_28);
  std::
  vector<testing::Matcher<pstore::gsl::not_null<pstore::command_line::option_const*>const&>,std::allocator<testing::Matcher<pstore::gsl::not_null<pstore::command_line::option_const*>const&>>>
  ::emplace_back<testing::Matcher<pstore::gsl::not_null<pstore::command_line::option_const*>const&>>
            (param_3,(Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&> *
                     )&MStack_28);
  MatcherBase<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>::~MatcherBase
            (&MStack_28);
  return (back_insert_iterator<std::vector<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>,_std::allocator<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>_>_>_>
          )(vector<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>,_std::allocator<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>_>_>
            *)param_3;
}

Assistant:

OutIter operator() (Func f, const Tup& t, OutIter out) const {
      *out++ = f(::std::get<TupleSize::value - kRemainingSize>(t));
      return IterateOverTuple<Tup, kRemainingSize - 1>()(f, t, out);
    }